

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TapeParser.hpp
# Opt level: O0

SymbolType __thiscall
Storage::Tape::Parser<Storage::Tape::ZXSpectrum::SymbolType>::get_next_symbol
          (Parser<Storage::Tape::ZXSpectrum::SymbolType> *this,shared_ptr<Storage::Tape::Tape> *tape
          )

{
  int iVar1;
  uint uVar2;
  element_type *peVar3;
  Pulse PVar4;
  byte local_41;
  undefined8 local_38;
  uint local_30;
  undefined8 local_24;
  uint local_1c;
  __shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_18;
  shared_ptr<Storage::Tape::Tape> *tape_local;
  Parser<Storage::Tape::ZXSpectrum::SymbolType> *this_local;
  
  local_18 = (__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             tape;
  tape_local = (shared_ptr<Storage::Tape::Tape> *)this;
  while( true ) {
    local_41 = 0;
    if ((this->has_next_symbol_ & 1U) == 0) {
      peVar3 = std::
               __shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_18);
      iVar1 = (**peVar3->_vptr_Tape)();
      local_41 = (byte)iVar1 ^ 0xff;
    }
    if ((local_41 & 1) == 0) break;
    peVar3 = std::__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_18);
    PVar4 = Tape::get_next_pulse(peVar3);
    local_38 = PVar4._0_8_;
    local_24 = local_38;
    local_30 = PVar4.length.clock_rate;
    local_1c = local_30;
    (**this->_vptr_Parser)(this,&local_24);
  }
  if ((this->has_next_symbol_ & 1U) == 0) {
    peVar3 = std::__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_18);
    uVar2 = (**peVar3->_vptr_Tape)();
    if ((uVar2 & 1) != 0) {
      (*this->_vptr_Parser[1])();
    }
  }
  this->has_next_symbol_ = false;
  return this->next_symbol_;
}

Assistant:

SymbolType get_next_symbol(const std::shared_ptr<Storage::Tape::Tape> &tape) {
			while(!has_next_symbol_ && !tape->is_at_end()) {
				process_pulse(tape->get_next_pulse());
			}
			if(!has_next_symbol_ && tape->is_at_end()) mark_end();
			has_next_symbol_ = false;
			return next_symbol_;
		}